

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CRETRCommand::doWhat(CRETRCommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  FILE *pFVar3;
  long lVar4;
  CPasvDataTransfer *pCVar5;
  CPortDataTransfer *this_00;
  ostream *poVar6;
  string *psVar7;
  string ip;
  string msg;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1048;
  char buffer [4096];
  
  EVar1 = CClient::GetClientState(pClient);
  if (EVar1 == PASV) {
    std::__cxx11::string::string((string *)&msg,"SENDFILE#",(allocator *)buffer);
    CClient::GetUserDir_abi_cxx11_((string *)buffer,pClient);
    iVar2 = chdir((char *)buffer._0_8_);
    std::__cxx11::string::~string((string *)buffer);
    if (iVar2 != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "Current user dir is error,now program will exit.");
      std::endl<char,std::char_traits<char>>(poVar6);
LAB_00107d91:
      exit(-1);
    }
    pFVar3 = fopen((this->super_CCommand).m_Args._M_dataplus._M_p,"rb");
    if (pFVar3 != (FILE *)0x0) {
      psVar7 = &(this->super_CCommand).m_Args;
      fseek(pFVar3,0,2);
      lVar4 = ftell(pFVar3);
      fclose(pFVar3);
      bzero(buffer,0x1000);
      sprintf(buffer,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
              (psVar7->_M_dataplus)._M_p,lVar4);
      std::__cxx11::string::string((string *)&ret,buffer,(allocator *)&ip);
      CClient::sendMsg(pClient,&ret);
      CClient::GetUserDir_abi_cxx11_(&ip,pClient);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&ip);
      std::operator+(&local_1048,&msg,"#");
      std::operator+(&ip,&local_1048,psVar7);
      std::__cxx11::string::operator=((string *)&msg,(string *)&ip);
      std::__cxx11::string::~string((string *)&ip);
      std::__cxx11::string::~string((string *)&local_1048);
      pCVar5 = CClient::SetClientPasvDataTransfer(pClient);
      CPasvDataTransfer::SetMsg(pCVar5,&msg);
      pCVar5 = CClient::SetClientPasvDataTransfer(pClient);
      CClient::GetClientfd(pClient);
      CPasvDataTransfer::SetControlSock(pCVar5);
      pCVar5 = CClient::SetClientPasvDataTransfer(pClient);
      CPasvDataTransfer::SetControlSock(pCVar5);
      CClient::SetClientState(pClient,PASS);
      CClient::SetClientPasvDataTransfer(pClient);
LAB_00107c8d:
      std::__cxx11::string::~string((string *)&ret);
      iVar2 = 1;
      goto LAB_00107d3c;
    }
    std::__cxx11::string::string((string *)buffer,"550 Failed to open file.\r\n",(allocator *)&ret);
    CClient::sendMsg(pClient,(string *)buffer);
  }
  else {
    EVar1 = CClient::GetClientState(pClient);
    if (EVar1 != PORT) {
      std::__cxx11::string::string
                ((string *)buffer,"425 Use PORT or PASV first.\r\n",(allocator *)&msg);
      CClient::sendMsg(pClient,(string *)buffer);
      std::__cxx11::string::~string((string *)buffer);
      return -1;
    }
    std::__cxx11::string::string((string *)&msg,"SENDFILE#",(allocator *)buffer);
    CClient::GetUserDir_abi_cxx11_((string *)buffer,pClient);
    iVar2 = chdir((char *)buffer._0_8_);
    std::__cxx11::string::~string((string *)buffer);
    if (iVar2 != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "Current user dir is error,now program will exit.");
      std::endl<char,std::char_traits<char>>(poVar6);
      goto LAB_00107d91;
    }
    pFVar3 = fopen((this->super_CCommand).m_Args._M_dataplus._M_p,"rb");
    if (pFVar3 != (FILE *)0x0) {
      psVar7 = &(this->super_CCommand).m_Args;
      fseek(pFVar3,0,2);
      lVar4 = ftell(pFVar3);
      fclose(pFVar3);
      bzero(buffer,0x1000);
      sprintf(buffer,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
              (psVar7->_M_dataplus)._M_p,lVar4);
      std::__cxx11::string::string((string *)&ret,buffer,(allocator *)&ip);
      CClient::sendMsg(pClient,&ret);
      CClient::GetUserDir_abi_cxx11_(&ip,pClient);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&ip);
      std::operator+(&local_1048,&msg,"#");
      std::operator+(&ip,&local_1048,psVar7);
      std::__cxx11::string::operator=((string *)&msg,(string *)&ip);
      std::__cxx11::string::~string((string *)&ip);
      std::__cxx11::string::~string((string *)&local_1048);
      ip._M_dataplus._M_p = (pointer)&ip.field_2;
      ip._M_string_length = 0;
      ip.field_2._M_local_buf[0] = '\0';
      iVar2 = CClient::GetClientPortIpAndPort(pClient,&ip);
      this_00 = (CPortDataTransfer *)operator_new(0x60);
      CPortDataTransfer::CPortDataTransfer(this_00,&ip,iVar2);
      CPortDataTransfer::SetMsg(this_00,&msg);
      iVar2 = CClient::GetClientfd(pClient);
      CPortDataTransfer::SetControlSock(this_00,iVar2);
      CThread::Run((CThread *)this_00);
      CClient::SetClientState(pClient,PASS);
      std::__cxx11::string::~string((string *)&ip);
      goto LAB_00107c8d;
    }
    std::__cxx11::string::string((string *)buffer,"550 Failed to open file.\r\n",(allocator *)&ret);
    CClient::sendMsg(pClient,(string *)buffer);
  }
  std::__cxx11::string::~string((string *)buffer);
  iVar2 = -1;
LAB_00107d3c:
  std::__cxx11::string::~string((string *)&msg);
  return iVar2;
}

Assistant:

int CRETRCommand::doWhat(CClient *pClient){
    if(pClient->GetClientState() == PASV){
        string msg = "SENDFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            FILE *file = fopen(m_Args.c_str(),"rb");
            if(file != NULL){
                fseek(file,0,2);
                long len = ftell(file);
                fclose(file);
                char buffer[BUFFER_SIZE];
                bzero(buffer,BUFFER_SIZE);
                sprintf(buffer,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
                        m_Args.c_str(),len);

                string ret(buffer);
                pClient->sendMsg(ret);

                msg += pClient->GetUserDir();
                msg = msg + "#" + m_Args;
                pClient->GetClientPasvDataTransfer()->SetMsg(msg);
                pClient->GetClientPasvDataTransfer()->SetControlSock(pClient->GetClientfd());
                pClient->GetClientPasvDataTransfer()->PostSignal();

                pClient->SetClientState(PASS);
                pClient->SetClientPasvDataTransfer(NULL);
                return 1;
            }
            else{
                string ret = "550 Failed to open file.\r\n";
                pClient->sendMsg(ret);
                return -1;
            }
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else if(pClient->GetClientState() == PORT){
        string msg = "SENDFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            FILE *file = fopen(m_Args.c_str(),"rb");
            if(file != NULL){
                fseek(file,0,2);
                long len = ftell(file);
                fclose(file);
                char buffer[BUFFER_SIZE];
                bzero(buffer,BUFFER_SIZE);
                sprintf(buffer,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
                        m_Args.c_str(),len);

                string ret(buffer);
                pClient->sendMsg(ret);

                msg += pClient->GetUserDir();
                msg = msg + "#" + m_Args;
                string ip;
                int port;

                port = pClient->GetClientPortIpAndPort(ip);

                CPortDataTransfer *c = new CPortDataTransfer(ip,port);
                c->SetMsg(msg);
                c->SetControlSock(pClient->GetClientfd());
                c->Run();

                pClient->SetClientState(PASS);
                return 1;
            }
            else{
                string ret = "550 Failed to open file.\r\n";
                pClient->sendMsg(ret);
                return -1;
            }
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else{
        string ret = "425 Use PORT or PASV first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}